

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::detail::
build_param_type_list<bool,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>
          (_func_bool_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr
           *param_1)

{
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_RDI;
  allocator_type *in_stack_ffffffffffffffa8;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffb0;
  initializer_list<chaiscript::Type_Info> in_stack_ffffffffffffffb8;
  
  user_type<bool>();
  user_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>();
  std::allocator<chaiscript::Type_Info>::allocator((allocator<chaiscript::Type_Info> *)0x3e1eab);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa8);
  std::allocator<chaiscript::Type_Info>::~allocator((allocator<chaiscript::Type_Info> *)0x3e1ed0);
  return in_RDI;
}

Assistant:

std::vector<Type_Info> build_param_type_list(Ret (*)(Params...))
        {
          /// \note somehow this is responsible for a large part of the code generation
          return { user_type<Ret>(), user_type<Params>()... };
        }